

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::ValueBuilder::appendToVar(ValueBuilder *this,Ref var,IString name,Ref value)

{
  Ref *pRVar1;
  ulong uVar2;
  Value *pVVar3;
  Ref r;
  Ref local_38;
  Ref local_30;
  Ref array;
  Ref value_local;
  IString name_local;
  Ref var_local;
  
  array.inst = (Value *)name.str._M_str;
  name_local.str._M_len = name.str._M_len;
  value_local = var;
  name_local.str._M_str = (char *)this;
  pRVar1 = (Ref *)cashew::Ref::operator[]((int)&name_local + 8);
  uVar2 = cashew::Ref::operator==(pRVar1,(IString *)&VAR);
  if ((uVar2 & 1) == 0) {
    __assert_fail("var[0] == VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x687,"static void cashew::ValueBuilder::appendToVar(Ref, IString, Ref)");
  }
  local_38 = makeRawArray(1);
  pVVar3 = Ref::operator->(&local_38);
  r = makeRawString((IString *)&value_local);
  pVVar3 = Value::push_back(pVVar3,r);
  Ref::Ref(&local_30,pVVar3);
  uVar2 = cashew::Ref::operator!(&array);
  if ((uVar2 & 1) == 0) {
    pVVar3 = Ref::operator->(&local_30);
    Value::push_back(pVVar3,array);
  }
  pRVar1 = (Ref *)cashew::Ref::operator[]((int)&name_local + 8);
  pVVar3 = Ref::operator->(pRVar1);
  Value::push_back(pVVar3,local_30);
  return;
}

Assistant:

static void appendToVar(Ref var, IString name, Ref value) {
    assert(var[0] == VAR);
    Ref array = &makeRawArray(1)->push_back(makeRawString(name));
    if (!!value) {
      array->push_back(value);
    }
    var[1]->push_back(array);
  }